

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall embree::TutorialApplication::renderInteractive(TutorialApplication *this)

{
  int iVar1;
  GLFWwindow *pGVar2;
  ImGuiContext *ctx;
  GLFWwindow *in_RDI;
  TutorialApplication *unaff_retaddr;
  ImGuiIO *io;
  ImFontAtlas *in_stack_00000020;
  ImGuiStyle *in_stack_00000380;
  GLFWwindow *in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0x17c) = *(undefined4 *)(in_RDI + 0x120);
  *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(in_RDI + 0x124);
  pGVar2 = in_RDI;
  glfwSetErrorCallback(errorFunc);
  glfwInit();
  glfwWindowHint((int)((ulong)in_stack_fffffffffffffff0 >> 0x20),(int)in_stack_fffffffffffffff0);
  glfwWindowHint((int)((ulong)in_stack_fffffffffffffff0 >> 0x20),(int)in_stack_fffffffffffffff0);
  if (((byte)in_RDI[0x179] & 1) == 0) {
    pGVar2 = createStandardWindow(unaff_retaddr,(int)((ulong)pGVar2 >> 0x20),(int)pGVar2);
    *(GLFWwindow **)(in_RDI + 0xa8) = pGVar2;
  }
  else {
    pGVar2 = createFullScreenWindow(this);
    *(GLFWwindow **)(in_RDI + 0xa8) = pGVar2;
  }
  glfwMakeContextCurrent(in_stack_fffffffffffffff0);
  glfwSwapInterval((int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  (**(code **)(*(long *)in_RDI + 0x48))(in_RDI,*(long *)(in_RDI + 0xa8),0);
  ImGui::CreateContext(in_stack_00000020);
  ctx = (ImGuiContext *)ImGui::GetIO();
  ImGui_ImplGlfw_InitForOpenGL((GLFWwindow *)ctx,SUB81((ulong)in_RDI >> 0x38,0));
  ImGui_ImplOpenGL2_Init();
  setCallbackFunctions((TutorialApplication *)ctx,in_RDI);
  ImGui::StyleColorsDark(in_stack_00000380);
  while( true ) {
    iVar1 = glfwWindowShouldClose(in_RDI);
    if (iVar1 != 0) break;
    glfwPollEvents();
    (**(code **)(*(long *)in_RDI + 0x40))();
  }
  ImGui_ImplOpenGL2_Shutdown();
  ImGui_ImplGlfw_Shutdown();
  ImGui::DestroyContext(ctx);
  glfwDestroyWindow((GLFWwindow *)unaff_retaddr);
  glfwTerminate();
  return;
}

Assistant:

void TutorialApplication::renderInteractive()
  {
    window_width = width;
    window_height = height;
    glfwSetErrorCallback(errorFunc);
    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR,2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR,0);

    if (fullscreen) window = createFullScreenWindow();
    else            window = createStandardWindow(width,height);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(0);
    reshapeFunc(window,0,0);

    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;

    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL2_Init();

    setCallbackFunctions(window);

    // Setup style
    ImGui::StyleColorsDark();

    while (!glfwWindowShouldClose(window))
    {
      glfwPollEvents();

      displayFunc();
    }

    // Cleanup
    ImGui_ImplOpenGL2_Shutdown();
    ImGui_ImplGlfw_Shutdown();
    ImGui::DestroyContext();

    glfwDestroyWindow(window);
    glfwTerminate();
  }